

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_casts.cpp
# Opt level: O2

bool duckdb::EnumEnumCast<unsigned_short,unsigned_char>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  bool bVar1;
  Vector *pVVar2;
  LogicalType res_enum_type;
  string_t *dictionary_data;
  VectorTryCastData vector_cast_data;
  undefined1 *local_50;
  string_t **local_48;
  CastParameters *local_40;
  VectorTryCastData *local_38;
  
  pVVar2 = EnumType::GetValuesInsertOrder(&source->type);
  dictionary_data = (string_t *)pVVar2->data;
  LogicalType::LogicalType(&res_enum_type,&result->type);
  local_38 = &vector_cast_data;
  vector_cast_data.all_converted = true;
  vector_cast_data.result = result;
  vector_cast_data.parameters = parameters;
  local_50 = &res_enum_type.id_;
  local_48 = &dictionary_data;
  local_40 = parameters;
  UnaryExecutor::
  ExecuteStandard<unsigned_short,unsigned_char,duckdb::UnaryLambdaWrapperWithNulls,duckdb::EnumEnumCast<unsigned_short,unsigned_char>(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::_lambda(unsigned_short,duckdb::ValidityMask&,unsigned_long)_1_>
            (source,result,count,&local_50,true,CAN_THROW_RUNTIME_ERROR);
  bVar1 = vector_cast_data.all_converted;
  LogicalType::~LogicalType(&res_enum_type);
  return bVar1;
}

Assistant:

bool EnumEnumCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &enum_dictionary = EnumType::GetValuesInsertOrder(source.GetType());
	auto dictionary_data = FlatVector::GetData<string_t>(enum_dictionary);
	auto res_enum_type = result.GetType();

	VectorTryCastData vector_cast_data(result, parameters);
	UnaryExecutor::ExecuteWithNulls<SRC_TYPE, RES_TYPE>(
	    source, result, count, [&](SRC_TYPE value, ValidityMask &mask, idx_t row_idx) {
		    auto key = EnumType::GetPos(res_enum_type, dictionary_data[value]);
		    if (key == -1) {
			    if (!parameters.error_message) {
				    return HandleVectorCastError::Operation<RES_TYPE>(CastExceptionText<SRC_TYPE, RES_TYPE>(value),
				                                                      mask, row_idx, vector_cast_data);
			    } else {
				    mask.SetInvalid(row_idx);
			    }
			    return RES_TYPE();
		    } else {
			    return UnsafeNumericCast<RES_TYPE>(key);
		    }
	    });
	return vector_cast_data.all_converted;
}